

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O2

Vec_Ptr_t * Fra_SmlSortUsingOnes(Fra_Sml_t *p,int fLatchCorr)

{
  int *piVar1;
  size_t __size;
  int iVar2;
  Vec_Ptr_t *p_00;
  int iVar3;
  int iVar4;
  uint uVar5;
  void *__ptr;
  void *pvVar6;
  void *pvVar7;
  Vec_Ptr_t *pVVar8;
  void **ppvVar9;
  Aig_Man_t *pAVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int local_60;
  
  if (p->nWordsTotal < 1) {
    __assert_fail("p->nWordsTotal > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraImp.c"
                  ,0x9f,"Vec_Ptr_t *Fra_SmlSortUsingOnes(Fra_Sml_t *, int)");
  }
  pAVar10 = p->pAig;
  pVVar8 = pAVar10->vObjs;
  uVar12 = (ulong)pVVar8->nSize;
  __ptr = calloc(1,uVar12 << 2);
  for (lVar14 = 0; lVar14 < (int)uVar12; lVar14 = lVar14 + 1) {
    pvVar6 = Vec_PtrEntry(pVVar8,(int)lVar14);
    if (pvVar6 != (void *)0x0) {
      iVar4 = Fra_SmlCountOnesOne(p,(int)lVar14);
      *(int *)((long)__ptr + lVar14 * 4) = iVar4;
    }
    pAVar10 = p->pAig;
    pVVar8 = pAVar10->vObjs;
    uVar12 = (ulong)(uint)pVVar8->nSize;
  }
  iVar4 = p->nWordsTotal;
  iVar3 = iVar4 * 0x20;
  __size = (long)iVar4 * 0x80 + 4;
  lVar14 = 1;
  pvVar6 = calloc(1,__size);
  local_60 = 0;
  for (lVar11 = 0; lVar11 < pAVar10->vObjs->nSize; lVar11 = lVar11 + 1) {
    pvVar7 = Vec_PtrEntry(pAVar10->vObjs,(int)lVar11);
    if ((lVar11 != 0) && (pvVar7 != (void *)0x0)) {
      uVar5 = (uint)*(undefined8 *)((long)pvVar7 + 0x18);
      if (fLatchCorr == 0) {
        uVar5 = uVar5 & 7;
        if ((uVar5 == 2) || (uVar5 - 5 < 2)) goto LAB_00557f89;
      }
      else if ((uVar5 & 7) == 2) {
LAB_00557f89:
        iVar2 = *(int *)((long)__ptr + lVar11 * 4);
        if (iVar3 < iVar2) {
          __assert_fail("pnBits[i] <= nBits",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraImp.c"
                        ,0xb8,"Vec_Ptr_t *Fra_SmlSortUsingOnes(Fra_Sml_t *, int)");
        }
        piVar1 = (int *)((long)pvVar6 + (long)iVar2 * 4);
        *piVar1 = *piVar1 + 1;
        local_60 = local_60 + 1;
      }
    }
    pAVar10 = p->pAig;
  }
  local_60 = local_60 + iVar3 + 1;
  pvVar7 = malloc((long)local_60 << 2);
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  iVar2 = 8;
  if (iVar4 != 0) {
    iVar2 = iVar3 + 1;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar2;
  ppvVar9 = (void **)malloc((long)iVar2 << 3);
  pVVar8->pArray = ppvVar9;
  Vec_PtrPush(pVVar8,pvVar7);
  for (; lVar14 <= iVar3; lVar14 = lVar14 + 1) {
    pvVar7 = (void *)((long)pvVar7 + (long)*(int *)((long)pvVar6 + lVar14 * 4 + -4) * 4 + 4);
    Vec_PtrPush(pVVar8,pvVar7);
  }
  lVar14 = 0;
  memset(pvVar6,0,__size);
  do {
    p_00 = p->pAig->vObjs;
    if (p_00->nSize <= lVar14) {
      uVar13 = 0;
      uVar12 = (ulong)(uint)pVVar8->nSize;
      if (pVVar8->nSize < 1) {
        uVar12 = uVar13;
      }
      iVar4 = 0;
      for (; uVar12 != uVar13; uVar13 = uVar13 + 1) {
        pvVar7 = Vec_PtrEntry(pVVar8,(int)uVar13);
        iVar3 = *(int *)((long)pvVar6 + uVar13 * 4);
        *(int *)((long)pvVar6 + uVar13 * 4) = iVar3 + 1;
        *(undefined4 *)((long)pvVar7 + (long)iVar3 * 4) = 0;
        iVar4 = iVar4 + iVar3 + 1;
      }
      if (iVar4 != local_60) {
        __assert_fail("nTotal == nNodes + nBits + 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraImp.c"
                      ,0xe3,"Vec_Ptr_t *Fra_SmlSortUsingOnes(Fra_Sml_t *, int)");
      }
      free(pvVar6);
      free(__ptr);
      return pVVar8;
    }
    pvVar7 = Vec_PtrEntry(p_00,(int)lVar14);
    if (lVar14 != 0 && pvVar7 != (void *)0x0) {
      uVar5 = (uint)*(undefined8 *)((long)pvVar7 + 0x18);
      if (fLatchCorr == 0) {
        uVar5 = uVar5 & 7;
        if ((uVar5 == 2) || (uVar5 - 5 < 2)) goto LAB_0055808a;
      }
      else if ((uVar5 & 7) == 2) {
LAB_0055808a:
        iVar4 = *(int *)((long)__ptr + lVar14 * 4);
        pvVar7 = Vec_PtrEntry(pVVar8,iVar4);
        iVar3 = *(int *)((long)pvVar6 + (long)iVar4 * 4);
        *(int *)((long)pvVar6 + (long)iVar4 * 4) = iVar3 + 1;
        *(int *)((long)pvVar7 + (long)iVar3 * 4) = (int)lVar14;
      }
    }
    lVar14 = lVar14 + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Fra_SmlSortUsingOnes( Fra_Sml_t * p, int fLatchCorr )
{
    Aig_Obj_t * pObj;
    Vec_Ptr_t * vNodes;
    int i, nNodes, nTotal, nBits, * pnNodes, * pnBits, * pMemory;
    assert( p->nWordsTotal > 0 );
    // count 1s in each node's siminfo
    pnBits = Fra_SmlCountOnes( p );
    // count number of nodes having that many 1s
    nNodes = 0;
    nBits = p->nWordsTotal * 32;
    pnNodes = ABC_ALLOC( int, nBits + 1 );
    memset( pnNodes, 0, sizeof(int) * (nBits + 1) );
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( i == 0 ) continue;
        // skip non-PI and non-internal nodes
        if ( fLatchCorr )
        {
            if ( !Aig_ObjIsCi(pObj) )
                continue;
        }
        else
        {
            if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                continue;
        }
        // skip nodes participating in the classes
//        if ( Fra_ClassObjRepr(pObj) )
//            continue;
        assert( pnBits[i] <= nBits ); // "<" because of normalized info
        pnNodes[pnBits[i]]++;
        nNodes++;
    }
    // allocate memory for all the nodes
    pMemory = ABC_ALLOC( int, nNodes + nBits + 1 );  
    // markup the memory for each node
    vNodes = Vec_PtrAlloc( nBits + 1 );
    Vec_PtrPush( vNodes, pMemory );
    for ( i = 1; i <= nBits; i++ )
    {
        pMemory += pnNodes[i-1] + 1;
        Vec_PtrPush( vNodes, pMemory );
    }
    // add the nodes
    memset( pnNodes, 0, sizeof(int) * (nBits + 1) );
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( i == 0 ) continue;
        // skip non-PI and non-internal nodes
        if ( fLatchCorr )
        {
            if ( !Aig_ObjIsCi(pObj) )
                continue;
        }
        else
        {
            if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                continue;
        }
        // skip nodes participating in the classes
//        if ( Fra_ClassObjRepr(pObj) )
//            continue;
        pMemory = (int *)Vec_PtrEntry( vNodes, pnBits[i] );
        pMemory[ pnNodes[pnBits[i]]++ ] = i;
    }
    // add 0s in the end
    nTotal = 0;
    Vec_PtrForEachEntry( int *, vNodes, pMemory, i )
    {
        pMemory[ pnNodes[i]++ ] = 0;
        nTotal += pnNodes[i];
    }
    assert( nTotal == nNodes + nBits + 1 );
    ABC_FREE( pnNodes );
    ABC_FREE( pnBits );
    return vNodes;
}